

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRle.cpp
# Opt level: O0

void testRle(string *param_1)

{
  ostream *poVar1;
  exception *e;
  int iter;
  Rand48 rand48;
  int numIter;
  unsigned_long in_stack_ffffffffffffff98;
  Rand48 *in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffa8;
  Rand48 *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffd4;
  int local_24;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"RLE compression:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"   Round tripping buffers ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Rand48::Rand48(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  for (local_24 = 0; local_24 < 1000; local_24 = local_24 + 1) {
    Imath_3_2::Rand48::nextf
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(double)in_stack_ffffffffffffffa0
              );
    anon_unknown.dwarf_214610::testRoundTrip(in_stack_ffffffffffffffd4);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testRle (const string&)
{
    cout << "RLE compression:" << endl;

    try
    {

        cout << "   Round tripping buffers " << endl;

        const int numIter = 1000;
        Rand48    rand48 (0);

        for (int iter = 0; iter < numIter; ++iter)
        {
            testRoundTrip ((int) rand48.nextf (100.0, 1000000.0));
        }
    }
    catch (const exception& e)
    {
        cout << "unexpected exception: " << e.what () << endl;
        assert (false);
    }
    catch (...)
    {
        cout << "unexpected exception" << endl;
        assert (false);
    }

    cout << "ok\n" << endl;
}